

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mnemonic.c
# Opt level: O3

char * mnemonic_from_bytes(words *w,uchar *bytes,size_t bytes_len)

{
  ulong uVar1;
  char **ppcVar2;
  ulong uVar3;
  size_t sVar4;
  char *pcVar5;
  ulong uVar6;
  long lVar7;
  ulong uVar8;
  char *pcVar9;
  char *__dest;
  long lVar10;
  size_t sVar11;
  ulong uVar12;
  
  uVar8 = bytes_len << 3;
  uVar1 = w->bits;
  pcVar5 = (char *)0x0;
  if (uVar1 <= uVar8) {
    ppcVar2 = w->indices;
    uVar12 = 0;
    sVar11 = 0;
    do {
      uVar3 = uVar12 * uVar1;
      if (uVar3 < uVar3 + uVar1) {
        lVar10 = 0;
        uVar6 = uVar1;
        do {
          lVar10 = (ulong)((bytes[uVar3 >> 3] >> (~(byte)uVar3 & 7) & 1) != 0) + lVar10 * 2;
          uVar3 = uVar3 + 1;
          uVar6 = uVar6 - 1;
        } while (uVar6 != 0);
      }
      else {
        lVar10 = 0;
      }
      sVar4 = strlen(ppcVar2[lVar10]);
      lVar10 = sVar11 + sVar4;
      sVar11 = lVar10 + 1;
      uVar12 = uVar12 + 1;
    } while (uVar12 < uVar8 / uVar1);
    if ((sVar11 == 0) || (pcVar5 = (char *)wally_malloc(sVar11), pcVar5 == (char *)0x0)) {
      pcVar5 = (char *)0x0;
    }
    else {
      if (uVar1 <= uVar8) {
        uVar12 = 0;
        __dest = pcVar5;
        do {
          sVar11 = w->bits;
          uVar3 = sVar11 * uVar12;
          if (uVar3 < uVar3 + sVar11) {
            lVar7 = 0;
            do {
              lVar7 = (ulong)((bytes[uVar3 >> 3] >> (~(byte)uVar3 & 7) & 1) != 0) + lVar7 * 2;
              uVar3 = uVar3 + 1;
              sVar11 = sVar11 - 1;
            } while (sVar11 != 0);
          }
          else {
            lVar7 = 0;
          }
          pcVar9 = w->indices[lVar7];
          sVar4 = strlen(pcVar9);
          memcpy(__dest,pcVar9,sVar4);
          pcVar9 = __dest + sVar4;
          __dest = pcVar9 + 1;
          *pcVar9 = ' ';
          uVar12 = uVar12 + 1;
        } while (uVar12 < uVar8 / uVar1);
      }
      pcVar5[lVar10] = '\0';
    }
  }
  return pcVar5;
}

Assistant:

char *mnemonic_from_bytes(const struct words *w, const unsigned char *bytes, size_t bytes_len)
{
    size_t total_bits = bytes_len * 8u; /* bits in 'bytes' */
    size_t total_mnemonics = total_bits / w->bits; /* Mnemonics in 'bytes' */
    size_t i, str_len = 0;
    char *str = NULL;

    /* Compute length of result */
    for (i = 0; i < total_mnemonics; ++i) {
        size_t idx = extract_index(w->bits, bytes, i);
        size_t mnemonic_len = strlen(w->indices[idx]);

        str_len += mnemonic_len + 1; /* +1 for following separator or NUL */
    }

    /* Allocate and fill result */
    if (str_len && (str = wally_malloc(str_len))) {
        char *out = str;

        for (i = 0; i < total_mnemonics; ++i) {
            size_t idx = extract_index(w->bits, bytes, i);
            size_t mnemonic_len = strlen(w->indices[idx]);

            memcpy(out, w->indices[idx], mnemonic_len);
            out[mnemonic_len] = ' '; /* separator */
            out += mnemonic_len + 1;
        }
        str[str_len - 1] = '\0'; /* Overwrite the last separator with NUL */
    }

    return str;
}